

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.cc
# Opt level: O0

void __thiscall
kratos::Port::Port(Port *this,Generator *module,PortDirection direction,string *name,uint32_t width,
                  uint32_t size,PortType type,bool is_signed)

{
  UserException *this_00;
  remove_reference_t<unsigned_int_&> *args_1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar1;
  string_view format_str;
  format_args args;
  string local_e8;
  undefined1 local_c1;
  uint32_t local_c0;
  undefined1 auStack_bc [3];
  bool is_signed_local;
  uint32_t size_local;
  uint32_t width_local;
  string *name_local;
  undefined8 uStack_a8;
  PortDirection direction_local;
  Generator *module_local;
  Port *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  basic_string_view<char> local_88;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_78;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_58;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *vargs;
  string *local_48;
  char *local_40;
  string *local_38;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *local_10;
  
  local_c1 = is_signed;
  args_1 = (remove_reference_t<unsigned_int_&> *)(ulong)size;
  aVar1._1_7_ = 0;
  aVar1._0_1_ = is_signed;
  local_c0 = size;
  _auStack_bc = width;
  _size_local = name;
  name_local._4_4_ = direction;
  uStack_a8 = module;
  module_local = (Generator *)this;
  Var::Var(&this->super_Var,module,name,width,size,is_signed,PortIO);
  (this->super_Var).super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005c1188;
  this->direction_ = name_local._4_4_;
  this->type_ = type;
  std::optional<bool>::optional(&this->active_high_);
  if (((((type == AsyncReset) || (type == Clock)) || (type == ClockEnable)) || (type == Reset)) &&
     (1 < _auStack_bc)) {
    this_00 = (UserException *)__cxa_allocate_exception(0x10);
    local_38 = &local_e8;
    local_40 = "{0}\'s width has be 1, got {1}";
    local_48 = _size_local;
    vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)auStack_bc;
    fmt::v7::make_args_checked<std::__cxx11::string_const&,unsigned_int&,char[30],char>
              (&local_78,(v7 *)"{0}\'s width has be 1, got {1}",(char (*) [30])_size_local,
               (remove_reference_t<const_std::__cxx11::basic_string<char>_&> *)vargs,args_1);
    local_58 = &local_78;
    local_88 = fmt::v7::to_string_view<char,_0>(local_40);
    local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                *)&this_local;
    local_30 = local_58;
    local_20 = local_58;
    local_10 = local_58;
    local_18 = local_28;
    fmt::v7::
    basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    ::basic_format_args(local_28,0x2d,
                        (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                         *)local_58);
    format_str.size_ = (size_t)this_local;
    format_str.data_ = (char *)local_88.size_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = aVar1.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)local_90.values_;
    fmt::v7::detail::vformat_abi_cxx11_(&local_e8,(detail *)local_88.data_,format_str,args);
    UserException::UserException(this_00,&local_e8);
    __cxa_throw(this_00,&UserException::typeinfo,UserException::~UserException);
  }
  return;
}

Assistant:

Port::Port(Generator* module, PortDirection direction, const ::string& name, uint32_t width,
           uint32_t size, PortType type, bool is_signed)
    : Var(module, name, width, size, is_signed, VarType::PortIO),
      direction_(direction),
      type_(type) {
    if ((type == PortType::AsyncReset || type == PortType::Clock || type == PortType::ClockEnable ||
         type == PortType::Reset) &&
        width > 1) {
        throw UserException(::format("{0}'s width has be 1, got {1}", name, width));
    }
}